

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O1

uint64 ReadFileToMemory(string *filename,char **buf)

{
  FILE *__stream;
  uint64 __n;
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  Logger local_74;
  string local_70;
  string local_50;
  
  if (filename->_M_string_length == 0) {
    local_74.severity_ = ERR;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ReadFileToMemory","");
    poVar3 = Logger::Start(ERR,&local_50,0xf6,&local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0xf6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!filename.empty()",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::operator<<(poVar3,"\n");
  }
  else {
    __stream = (FILE *)OpenFileOrDie((filename->_M_dataplus)._M_p,"r");
    __n = GetFileSize((FILE *)__stream);
    pcVar1 = (char *)operator_new__(__n);
    *buf = pcVar1;
    sVar2 = fread(*buf,1,__n,__stream);
    if (sVar2 == __n) {
      Close((FILE *)__stream);
      return __n;
    }
    local_74.severity_ = ERR;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ReadFileToMemory","");
    poVar3 = Logger::Start(ERR,&local_50,0x103,&local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK_EQ failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x103);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"read_size",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"len",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  Logger::~Logger(&local_74);
  abort();
}

Assistant:

inline uint64 ReadFileToMemory(const std::string &filename, char **buf) {
  CHECK(!filename.empty());
#ifndef _MSC_VER
  FILE *file = OpenFileOrDie(filename.c_str(), "r");
#else
  FILE *file = OpenFileOrDie(filename.c_str(), "rb");
#endif
  uint64 len = GetFileSize(file);
  try {
    *buf = new char[len];
  } catch (std::bad_alloc &) {
    LOG(FATAL) << "Cannot allocate enough memory for Reader.";
  }
  uint64 read_size = fread(*buf, 1, len, file);
  CHECK_EQ(read_size, len);
  Close(file);
  return len;
}